

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O2

exr_result_t read_magic_and_flags(exr_context_t ctxt,uint32_t *outflags,uint64_t *initpos)

{
  exr_result_t eVar1;
  char *pcVar2;
  ulong uVar3;
  uint32_t magic_and_version [2];
  int64_t nread;
  uint64_t fileoff;
  
  fileoff = 0;
  nread = 0;
  eVar1 = (*ctxt->do_read)(ctxt,magic_and_version,8,&fileoff,&nread,EXR_MUST_READ_ALL);
  if (eVar1 == 0) {
    *initpos = 8;
    if (magic_and_version[0] == 0x1312f76) {
      ctxt->orig_version_and_flags = magic_and_version[1];
      ctxt->version = (uint8_t)magic_and_version[1];
      magic_and_version[0] = magic_and_version[1] & 0xff;
      if (magic_and_version[0] == 2) {
        if ((magic_and_version[1] & 0xffffe100) != 0) {
          eVar1 = (*ctxt->print_error)
                            (ctxt,6,"File has an unsupported flags: magic 0x%08X flags 0x%08X",
                             0x1312f76,(ulong)magic_and_version[1]);
          return eVar1;
        }
        *outflags = magic_and_version[1] & 0x1e00;
        return 0;
      }
      pcVar2 = "File is of an unsupported version: %d, magic 0x%08X flags 0x%08X";
      uVar3 = 0x1312f76;
    }
    else {
      pcVar2 = "File is not an OpenEXR file: magic 0x%08X (%d) flags 0x%08X";
      uVar3 = (ulong)magic_and_version[0];
    }
    eVar1 = (*ctxt->print_error)
                      (ctxt,6,pcVar2,(ulong)magic_and_version[0],uVar3,(ulong)magic_and_version[1]);
  }
  else {
    (*ctxt->report_error)(ctxt,10,"Unable to read magic and version flags");
  }
  return eVar1;
}

Assistant:

static exr_result_t
read_magic_and_flags (exr_context_t ctxt, uint32_t* outflags, uint64_t* initpos)
{
    uint32_t     magic_and_version[2];
    uint32_t     flags;
    exr_result_t rv      = EXR_ERR_UNKNOWN;
    uint64_t     fileoff = 0;
    int64_t      nread   = 0;

    rv = ctxt->do_read (
        ctxt,
        magic_and_version,
        sizeof (uint32_t) * 2,
        &fileoff,
        &nread,
        EXR_MUST_READ_ALL);
    if (rv != EXR_ERR_SUCCESS)
    {
        ctxt->report_error (
            ctxt, EXR_ERR_READ_IO, "Unable to read magic and version flags");
        return rv;
    }

    *initpos = sizeof (uint32_t) * 2;

    priv_to_native32 (magic_and_version, 2);
    if (magic_and_version[0] != 20000630)
    {
        rv = ctxt->print_error (
            ctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "File is not an OpenEXR file: magic 0x%08X (%d) flags 0x%08X",
            magic_and_version[0],
            (int) magic_and_version[0],
            magic_and_version[1]);
        return rv;
    }

    flags = magic_and_version[1];

    ctxt->orig_version_and_flags = flags;
    ctxt->version = flags & EXR_FILE_VERSION_MASK;
    if (ctxt->version != 2)
    {
        rv = ctxt->print_error (
            ctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "File is of an unsupported version: %d, magic 0x%08X flags 0x%08X",
            (int) ctxt->version,
            magic_and_version[0],
            magic_and_version[1]);
        return rv;
    }

    flags = flags & ~((uint32_t) EXR_FILE_VERSION_MASK);
    if ((flags & ~((uint32_t) EXR_VALID_FLAGS)) != 0)
    {
        rv = ctxt->print_error (
            ctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "File has an unsupported flags: magic 0x%08X flags 0x%08X",
            magic_and_version[0],
            magic_and_version[1]);
        return rv;
    }
    *outflags = flags;
    return EXR_ERR_SUCCESS;
}